

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void initCSharpData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  initializer_list<std::pair<char,_QLatin1String>_> list_02;
  QLatin1String local_1598;
  char local_1581;
  QLatin1String local_1580;
  char local_1569;
  QLatin1String local_1568;
  char local_1551;
  QLatin1String local_1550;
  char local_1539;
  QLatin1String local_1538;
  char local_1521;
  QLatin1String local_1520;
  char local_1509;
  QLatin1String local_1508;
  char local_14f1;
  QLatin1String local_14f0;
  char local_14d9;
  QLatin1String local_14d8;
  char local_14c1;
  QLatin1String local_14c0;
  char local_14a9;
  QLatin1String local_14a8;
  char local_1491;
  QLatin1String local_1490;
  char local_1479;
  pair<char,_QLatin1String> local_1478;
  pair<char,_QLatin1String> pStack_1460;
  pair<char,_QLatin1String> pStack_1448;
  pair<char,_QLatin1String> pStack_1430;
  pair<char,_QLatin1String> pStack_1418;
  pair<char,_QLatin1String> pStack_1400;
  pair<char,_QLatin1String> pStack_13e8;
  pair<char,_QLatin1String> pStack_13d0;
  pair<char,_QLatin1String> pStack_13b8;
  pair<char,_QLatin1String> pStack_13a0;
  pair<char,_QLatin1String> pStack_1388;
  pair<char,_QLatin1String> pStack_1370;
  iterator local_1358;
  undefined8 local_1350;
  QMultiHash<char,_QLatin1String> local_1348;
  QMultiHash<char,_QLatin1String> local_1338;
  QLatin1String local_1328;
  char local_1311;
  QLatin1String local_1310;
  char local_12f9;
  QLatin1String local_12f8;
  char local_12e1;
  pair<char,_QLatin1String> local_12e0;
  pair<char,_QLatin1String> pStack_12c8;
  pair<char,_QLatin1String> pStack_12b0;
  iterator local_1298;
  undefined8 local_1290;
  QMultiHash<char,_QLatin1String> local_1288;
  QLatin1String local_1278;
  char local_1261;
  QLatin1String local_1260;
  char local_1249;
  QLatin1String local_1248;
  char local_1231;
  QLatin1String local_1230;
  char local_1219;
  QLatin1String local_1218;
  char local_1201;
  QLatin1String local_1200;
  char local_11e9;
  QLatin1String local_11e8;
  char local_11d1;
  QLatin1String local_11d0;
  char local_11b9;
  QLatin1String local_11b8;
  char local_11a1;
  QLatin1String local_11a0;
  char local_1189;
  QLatin1String local_1188;
  char local_1171;
  QLatin1String local_1170;
  char local_1159;
  QLatin1String local_1158;
  char local_1141;
  QLatin1String local_1140;
  char local_1129;
  QLatin1String local_1128;
  char local_1111;
  QLatin1String local_1110;
  char local_10f9;
  QLatin1String local_10f8;
  char local_10e1;
  pair<char,_QLatin1String> local_10e0;
  pair<char,_QLatin1String> pStack_10c8;
  pair<char,_QLatin1String> pStack_10b0;
  pair<char,_QLatin1String> pStack_1098;
  pair<char,_QLatin1String> pStack_1080;
  pair<char,_QLatin1String> pStack_1068;
  pair<char,_QLatin1String> pStack_1050;
  pair<char,_QLatin1String> pStack_1038;
  pair<char,_QLatin1String> pStack_1020;
  pair<char,_QLatin1String> pStack_1008;
  pair<char,_QLatin1String> pStack_ff0;
  pair<char,_QLatin1String> pStack_fd8;
  pair<char,_QLatin1String> pStack_fc0;
  pair<char,_QLatin1String> pStack_fa8;
  pair<char,_QLatin1String> pStack_f90;
  pair<char,_QLatin1String> pStack_f78;
  pair<char,_QLatin1String> pStack_f60;
  iterator local_f48;
  undefined8 local_f40;
  QMultiHash<char,_QLatin1String> local_f38;
  QLatin1String local_f28;
  char local_f11;
  QLatin1String local_f10;
  char local_ef9;
  QLatin1String local_ef8;
  char local_ee1;
  QLatin1String local_ee0;
  char local_ec9;
  QLatin1String local_ec8;
  char local_eb1;
  QLatin1String local_eb0;
  char local_e99;
  QLatin1String local_e98;
  char local_e81;
  QLatin1String local_e80;
  char local_e69;
  QLatin1String local_e68;
  char local_e51;
  QLatin1String local_e50;
  char local_e39;
  QLatin1String local_e38;
  char local_e21;
  QLatin1String local_e20;
  char local_e09;
  QLatin1String local_e08;
  char local_df1;
  QLatin1String local_df0;
  char local_dd9;
  QLatin1String local_dd8;
  char local_dc1;
  QLatin1String local_dc0;
  char local_da9;
  QLatin1String local_da8;
  char local_d91;
  QLatin1String local_d90;
  char local_d79;
  QLatin1String local_d78;
  char local_d61;
  QLatin1String local_d60;
  char local_d49;
  QLatin1String local_d48;
  char local_d31;
  QLatin1String local_d30;
  char local_d19;
  QLatin1String local_d18;
  char local_d01;
  QLatin1String local_d00;
  char local_ce9;
  QLatin1String local_ce8;
  char local_cd1;
  QLatin1String local_cd0;
  char local_cb9;
  QLatin1String local_cb8;
  char local_ca1;
  QLatin1String local_ca0;
  char local_c89;
  QLatin1String local_c88;
  char local_c71;
  QLatin1String local_c70;
  char local_c59;
  QLatin1String local_c58;
  char local_c41;
  QLatin1String local_c40;
  char local_c29;
  QLatin1String local_c28;
  char local_c11;
  QLatin1String local_c10;
  char local_bf9;
  QLatin1String local_bf8;
  char local_be1;
  QLatin1String local_be0;
  char local_bc9;
  QLatin1String local_bc8;
  char local_bb1;
  QLatin1String local_bb0;
  char local_b99;
  QLatin1String local_b98;
  char local_b81;
  QLatin1String local_b80;
  char local_b69;
  QLatin1String local_b68;
  char local_b51;
  QLatin1String local_b50;
  char local_b39;
  QLatin1String local_b38;
  char local_b21;
  QLatin1String local_b20;
  char local_b09;
  QLatin1String local_b08;
  char local_af1;
  QLatin1String local_af0;
  char local_ad9;
  QLatin1String local_ad8;
  char local_ac1;
  QLatin1String local_ac0;
  char local_aa9;
  QLatin1String local_aa8;
  char local_a91;
  QLatin1String local_a90;
  char local_a79;
  QLatin1String local_a78;
  char local_a61;
  QLatin1String local_a60;
  char local_a49;
  QLatin1String local_a48;
  char local_a31;
  QLatin1String local_a30;
  char local_a19;
  QLatin1String local_a18;
  char local_a01;
  QLatin1String local_a00;
  char local_9e9;
  QLatin1String local_9e8;
  char local_9d1;
  QLatin1String local_9d0;
  char local_9b9;
  QLatin1String local_9b8;
  char local_9a1;
  QLatin1String local_9a0;
  char local_989;
  QLatin1String local_988;
  char local_971;
  QLatin1String local_970;
  char local_959;
  QLatin1String local_958;
  char local_941;
  QLatin1String local_940;
  char local_929;
  QLatin1String local_928;
  char local_911;
  QLatin1String local_910;
  char local_8f9;
  QLatin1String local_8f8;
  char local_8e1;
  QLatin1String local_8e0;
  char local_8c9;
  QLatin1String local_8c8;
  char local_8b1;
  QLatin1String local_8b0;
  char local_899;
  QLatin1String local_898;
  char local_881;
  QLatin1String local_880;
  char local_869;
  QLatin1String local_868;
  char local_851;
  QLatin1String local_850;
  char local_839;
  QLatin1String local_838;
  char local_821;
  QLatin1String local_820;
  char local_809;
  QLatin1String local_808;
  char local_7f1;
  QLatin1String local_7f0;
  char local_7d9;
  QLatin1String local_7d8;
  char local_7c1;
  QLatin1String local_7c0;
  char local_7a9;
  pair<char,_QLatin1String> local_7a8;
  pair<char,_QLatin1String> pStack_790;
  pair<char,_QLatin1String> pStack_778;
  pair<char,_QLatin1String> pStack_760;
  pair<char,_QLatin1String> pStack_748;
  pair<char,_QLatin1String> pStack_730;
  pair<char,_QLatin1String> pStack_718;
  pair<char,_QLatin1String> pStack_700;
  pair<char,_QLatin1String> pStack_6e8;
  pair<char,_QLatin1String> pStack_6d0;
  pair<char,_QLatin1String> pStack_6b8;
  pair<char,_QLatin1String> pStack_6a0;
  pair<char,_QLatin1String> pStack_688;
  pair<char,_QLatin1String> pStack_670;
  pair<char,_QLatin1String> pStack_658;
  pair<char,_QLatin1String> pStack_640;
  pair<char,_QLatin1String> pStack_628;
  pair<char,_QLatin1String> pStack_610;
  pair<char,_QLatin1String> pStack_5f8;
  pair<char,_QLatin1String> pStack_5e0;
  pair<char,_QLatin1String> pStack_5c8;
  pair<char,_QLatin1String> pStack_5b0;
  pair<char,_QLatin1String> pStack_598;
  pair<char,_QLatin1String> pStack_580;
  pair<char,_QLatin1String> pStack_568;
  pair<char,_QLatin1String> pStack_550;
  pair<char,_QLatin1String> pStack_538;
  pair<char,_QLatin1String> pStack_520;
  pair<char,_QLatin1String> pStack_508;
  pair<char,_QLatin1String> pStack_4f0;
  pair<char,_QLatin1String> pStack_4d8;
  pair<char,_QLatin1String> pStack_4c0;
  pair<char,_QLatin1String> pStack_4a8;
  pair<char,_QLatin1String> pStack_490;
  pair<char,_QLatin1String> pStack_478;
  pair<char,_QLatin1String> pStack_460;
  pair<char,_QLatin1String> pStack_448;
  pair<char,_QLatin1String> pStack_430;
  pair<char,_QLatin1String> pStack_418;
  pair<char,_QLatin1String> pStack_400;
  pair<char,_QLatin1String> pStack_3e8;
  pair<char,_QLatin1String> pStack_3d0;
  pair<char,_QLatin1String> pStack_3b8;
  pair<char,_QLatin1String> pStack_3a0;
  pair<char,_QLatin1String> pStack_388;
  pair<char,_QLatin1String> pStack_370;
  pair<char,_QLatin1String> pStack_358;
  pair<char,_QLatin1String> pStack_340;
  pair<char,_QLatin1String> pStack_328;
  pair<char,_QLatin1String> pStack_310;
  pair<char,_QLatin1String> pStack_2f8;
  pair<char,_QLatin1String> pStack_2e0;
  pair<char,_QLatin1String> pStack_2c8;
  pair<char,_QLatin1String> pStack_2b0;
  pair<char,_QLatin1String> pStack_298;
  pair<char,_QLatin1String> pStack_280;
  pair<char,_QLatin1String> pStack_268;
  pair<char,_QLatin1String> pStack_250;
  pair<char,_QLatin1String> pStack_238;
  pair<char,_QLatin1String> pStack_220;
  pair<char,_QLatin1String> pStack_208;
  pair<char,_QLatin1String> pStack_1f0;
  pair<char,_QLatin1String> pStack_1d8;
  pair<char,_QLatin1String> pStack_1c0;
  pair<char,_QLatin1String> pStack_1a8;
  pair<char,_QLatin1String> pStack_190;
  pair<char,_QLatin1String> pStack_178;
  pair<char,_QLatin1String> pStack_160;
  pair<char,_QLatin1String> pStack_148;
  pair<char,_QLatin1String> pStack_130;
  pair<char,_QLatin1String> pStack_118;
  pair<char,_QLatin1String> pStack_100;
  pair<char,_QLatin1String> pStack_e8;
  pair<char,_QLatin1String> pStack_d0;
  pair<char,_QLatin1String> pStack_b8;
  pair<char,_QLatin1String> pStack_a0;
  pair<char,_QLatin1String> pStack_88;
  pair<char,_QLatin1String> pStack_70;
  pair<char,_QLatin1String> pStack_58;
  pair<char,_QLatin1String> pStack_40;
  iterator local_28;
  undefined8 local_20;
  QMultiHash<char,_QLatin1String> local_18;
  
  local_7a9 = 'a';
  QLatin1String::QLatin1String(&local_7c0,"abstract");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&local_7a8,&local_7a9,&local_7c0);
  local_7c1 = 'a';
  QLatin1String::QLatin1String(&local_7d8,"add");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_790,&local_7c1,&local_7d8)
  ;
  local_7d9 = 'a';
  QLatin1String::QLatin1String(&local_7f0,"alias");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_778,&local_7d9,&local_7f0)
  ;
  local_7f1 = 'a';
  QLatin1String::QLatin1String(&local_808,"as");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_760,&local_7f1,&local_808)
  ;
  local_809 = 'a';
  QLatin1String::QLatin1String(&local_820,"ascending");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_748,&local_809,&local_820)
  ;
  local_821 = 'a';
  QLatin1String::QLatin1String(&local_838,"async");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_730,&local_821,&local_838)
  ;
  local_839 = 'a';
  QLatin1String::QLatin1String(&local_850,"await");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_718,&local_839,&local_850)
  ;
  local_851 = 'b';
  QLatin1String::QLatin1String(&local_868,"base");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_700,&local_851,&local_868)
  ;
  local_869 = 'b';
  QLatin1String::QLatin1String(&local_880,"break");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_6e8,&local_869,&local_880)
  ;
  local_881 = 'c';
  QLatin1String::QLatin1String(&local_898,"case");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_6d0,&local_881,&local_898)
  ;
  local_899 = 'c';
  QLatin1String::QLatin1String(&local_8b0,"catch");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_6b8,&local_899,&local_8b0)
  ;
  local_8b1 = 'c';
  QLatin1String::QLatin1String(&local_8c8,"checked");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_6a0,&local_8b1,&local_8c8)
  ;
  local_8c9 = 'c';
  QLatin1String::QLatin1String(&local_8e0,"const");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_688,&local_8c9,&local_8e0)
  ;
  local_8e1 = 'c';
  QLatin1String::QLatin1String(&local_8f8,"continue");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_670,&local_8e1,&local_8f8)
  ;
  local_8f9 = 'd';
  QLatin1String::QLatin1String(&local_910,"decimal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_658,&local_8f9,&local_910)
  ;
  local_911 = 'd';
  QLatin1String::QLatin1String(&local_928,"default");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_640,&local_911,&local_928)
  ;
  local_929 = 'd';
  QLatin1String::QLatin1String(&local_940,"delegate");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_628,&local_929,&local_940)
  ;
  local_941 = 'd';
  QLatin1String::QLatin1String(&local_958,"descending");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_610,&local_941,&local_958)
  ;
  local_959 = 'd';
  QLatin1String::QLatin1String(&local_970,"do");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_5f8,&local_959,&local_970)
  ;
  local_971 = 'd';
  QLatin1String::QLatin1String(&local_988,"dynamic");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_5e0,&local_971,&local_988)
  ;
  local_989 = 'e';
  QLatin1String::QLatin1String(&local_9a0,"else");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_5c8,&local_989,&local_9a0)
  ;
  local_9a1 = 'e';
  QLatin1String::QLatin1String(&local_9b8,"event");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_5b0,&local_9a1,&local_9b8)
  ;
  local_9b9 = 'e';
  QLatin1String::QLatin1String(&local_9d0,"explicit");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_598,&local_9b9,&local_9d0)
  ;
  local_9d1 = 'e';
  QLatin1String::QLatin1String(&local_9e8,"extern");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_580,&local_9d1,&local_9e8)
  ;
  local_9e9 = 'f';
  QLatin1String::QLatin1String(&local_a00,"finally");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_568,&local_9e9,&local_a00)
  ;
  local_a01 = 'f';
  QLatin1String::QLatin1String(&local_a18,"fixed");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_550,&local_a01,&local_a18)
  ;
  local_a19 = 'f';
  QLatin1String::QLatin1String(&local_a30,"for");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_538,&local_a19,&local_a30)
  ;
  local_a31 = 'f';
  QLatin1String::QLatin1String(&local_a48,"foreach");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_520,&local_a31,&local_a48)
  ;
  local_a49 = 'f';
  QLatin1String::QLatin1String(&local_a60,"from");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_508,&local_a49,&local_a60)
  ;
  local_a61 = 'g';
  QLatin1String::QLatin1String(&local_a78,"get");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4f0,&local_a61,&local_a78)
  ;
  local_a79 = 'g';
  QLatin1String::QLatin1String(&local_a90,"global");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4d8,&local_a79,&local_a90)
  ;
  local_a91 = 'g';
  QLatin1String::QLatin1String(&local_aa8,"goto");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4c0,&local_a91,&local_aa8)
  ;
  local_aa9 = 'g';
  QLatin1String::QLatin1String(&local_ac0,"group");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_4a8,&local_aa9,&local_ac0)
  ;
  local_ac1 = 'i';
  QLatin1String::QLatin1String(&local_ad8,"if");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_490,&local_ac1,&local_ad8)
  ;
  local_ad9 = 'i';
  QLatin1String::QLatin1String(&local_af0,"implicit");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_478,&local_ad9,&local_af0)
  ;
  local_af1 = 'i';
  QLatin1String::QLatin1String(&local_b08,"in");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_460,&local_af1,&local_b08)
  ;
  local_b09 = 'i';
  QLatin1String::QLatin1String(&local_b20,"interface");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_448,&local_b09,&local_b20)
  ;
  local_b21 = 'i';
  QLatin1String::QLatin1String(&local_b38,"internal");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_430,&local_b21,&local_b38)
  ;
  local_b39 = 'i';
  QLatin1String::QLatin1String(&local_b50,"into");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_418,&local_b39,&local_b50)
  ;
  local_b51 = 'i';
  QLatin1String::QLatin1String(&local_b68,"is");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_400,&local_b51,&local_b68)
  ;
  local_b69 = 'j';
  QLatin1String::QLatin1String(&local_b80,"join");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3e8,&local_b69,&local_b80)
  ;
  local_b81 = 'l';
  QLatin1String::QLatin1String(&local_b98,"let");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3d0,&local_b81,&local_b98)
  ;
  local_b99 = 'l';
  QLatin1String::QLatin1String(&local_bb0,"lock");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3b8,&local_b99,&local_bb0)
  ;
  local_bb1 = 'l';
  QLatin1String::QLatin1String(&local_bc8,"long");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_3a0,&local_bb1,&local_bc8)
  ;
  local_bc9 = 'n';
  QLatin1String::QLatin1String(&local_be0,"namespace");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_388,&local_bc9,&local_be0)
  ;
  local_be1 = 'n';
  QLatin1String::QLatin1String(&local_bf8,"new");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_370,&local_be1,&local_bf8)
  ;
  local_bf9 = 'o';
  QLatin1String::QLatin1String(&local_c10,"object");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_358,&local_bf9,&local_c10)
  ;
  local_c11 = 'o';
  QLatin1String::QLatin1String(&local_c28,"operator");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_340,&local_c11,&local_c28)
  ;
  local_c29 = 'o';
  QLatin1String::QLatin1String(&local_c40,"orderby");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_328,&local_c29,&local_c40)
  ;
  local_c41 = 'o';
  QLatin1String::QLatin1String(&local_c58,"out");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_310,&local_c41,&local_c58)
  ;
  local_c59 = 'o';
  QLatin1String::QLatin1String(&local_c70,"override");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2f8,&local_c59,&local_c70)
  ;
  local_c71 = 'p';
  QLatin1String::QLatin1String(&local_c88,"params");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2e0,&local_c71,&local_c88)
  ;
  local_c89 = 'p';
  QLatin1String::QLatin1String(&local_ca0,"partial");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2c8,&local_c89,&local_ca0)
  ;
  local_ca1 = 'p';
  QLatin1String::QLatin1String(&local_cb8,"private");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_2b0,&local_ca1,&local_cb8)
  ;
  local_cb9 = 'p';
  QLatin1String::QLatin1String(&local_cd0,"protected");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_298,&local_cb9,&local_cd0)
  ;
  local_cd1 = 'p';
  QLatin1String::QLatin1String(&local_ce8,"public");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_280,&local_cd1,&local_ce8)
  ;
  local_ce9 = 'r';
  QLatin1String::QLatin1String(&local_d00,"readonly");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_268,&local_ce9,&local_d00)
  ;
  local_d01 = 'r';
  QLatin1String::QLatin1String(&local_d18,"ref");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_250,&local_d01,&local_d18)
  ;
  local_d19 = 'r';
  QLatin1String::QLatin1String(&local_d30,"remove");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_238,&local_d19,&local_d30)
  ;
  local_d31 = 'r';
  QLatin1String::QLatin1String(&local_d48,"return");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_220,&local_d31,&local_d48)
  ;
  local_d49 = 's';
  QLatin1String::QLatin1String(&local_d60,"sealed");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_208,&local_d49,&local_d60)
  ;
  local_d61 = 's';
  QLatin1String::QLatin1String(&local_d78,"select");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1f0,&local_d61,&local_d78)
  ;
  local_d79 = 's';
  QLatin1String::QLatin1String(&local_d90,"set");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1d8,&local_d79,&local_d90)
  ;
  local_d91 = 's';
  QLatin1String::QLatin1String(&local_da8,"sizeof");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1c0,&local_d91,&local_da8)
  ;
  local_da9 = 's';
  QLatin1String::QLatin1String(&local_dc0,"stackalloc");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_1a8,&local_da9,&local_dc0)
  ;
  local_dc1 = 's';
  QLatin1String::QLatin1String(&local_dd8,"static");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_190,&local_dc1,&local_dd8)
  ;
  local_dd9 = 's';
  QLatin1String::QLatin1String(&local_df0,"switch");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_178,&local_dd9,&local_df0)
  ;
  local_df1 = 't';
  QLatin1String::QLatin1String(&local_e08,"this");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_160,&local_df1,&local_e08)
  ;
  local_e09 = 't';
  QLatin1String::QLatin1String(&local_e20,"throw");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_148,&local_e09,&local_e20)
  ;
  local_e21 = 't';
  QLatin1String::QLatin1String(&local_e38,"try");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_130,&local_e21,&local_e38)
  ;
  local_e39 = 't';
  QLatin1String::QLatin1String(&local_e50,"typeof");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_118,&local_e39,&local_e50)
  ;
  local_e51 = 'u';
  QLatin1String::QLatin1String(&local_e68,"unchecked");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_100,&local_e51,&local_e68)
  ;
  local_e69 = 'u';
  QLatin1String::QLatin1String(&local_e80,"unsafe");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_e8,&local_e69,&local_e80);
  local_e81 = 'u';
  QLatin1String::QLatin1String(&local_e98,"using");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_d0,&local_e81,&local_e98);
  local_e99 = 'v';
  QLatin1String::QLatin1String(&local_eb0,"value");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_b8,&local_e99,&local_eb0);
  local_eb1 = 'v';
  QLatin1String::QLatin1String(&local_ec8,"virtual");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_a0,&local_eb1,&local_ec8);
  local_ec9 = 'v';
  QLatin1String::QLatin1String(&local_ee0,"volatile");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_88,&local_ec9,&local_ee0);
  local_ee1 = 'w';
  QLatin1String::QLatin1String(&local_ef8,"where");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_70,&local_ee1,&local_ef8);
  local_ef9 = 'w';
  QLatin1String::QLatin1String(&local_f10,"while");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_58,&local_ef9,&local_f10);
  local_f11 = 'y';
  QLatin1String::QLatin1String(&local_f28,"yield");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>(&pStack_40,&local_f11,&local_f28);
  local_28 = &local_7a8;
  local_20 = 0x50;
  list_02._M_len = 0x50;
  list_02._M_array = local_28;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_18,list_02);
  QMultiHash<char,_QLatin1String>::operator=(&csharp_keywords,&local_18);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_18);
  local_10e1 = 'b';
  QLatin1String::QLatin1String(&local_10f8,"bool");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_10e0,&local_10e1,&local_10f8);
  local_10f9 = 'b';
  QLatin1String::QLatin1String(&local_1110,"byte");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10c8,&local_10f9,&local_1110);
  local_1111 = 'c';
  QLatin1String::QLatin1String(&local_1128,"char");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10b0,&local_1111,&local_1128);
  local_1129 = 'c';
  QLatin1String::QLatin1String(&local_1140,"class");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1098,&local_1129,&local_1140);
  local_1141 = 'd';
  QLatin1String::QLatin1String(&local_1158,"double");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1080,&local_1141,&local_1158);
  local_1159 = 'e';
  QLatin1String::QLatin1String(&local_1170,"enum");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1068,&local_1159,&local_1170);
  local_1171 = 'f';
  QLatin1String::QLatin1String(&local_1188,"float");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1050,&local_1171,&local_1188);
  local_1189 = 'i';
  QLatin1String::QLatin1String(&local_11a0,"int");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1038,&local_1189,&local_11a0);
  local_11a1 = 's';
  QLatin1String::QLatin1String(&local_11b8,"sbyte");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1020,&local_11a1,&local_11b8);
  local_11b9 = 's';
  QLatin1String::QLatin1String(&local_11d0,"short");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1008,&local_11b9,&local_11d0);
  local_11d1 = 's';
  QLatin1String::QLatin1String(&local_11e8,"string");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ff0,&local_11d1,&local_11e8);
  local_11e9 = 's';
  QLatin1String::QLatin1String(&local_1200,"struct");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fd8,&local_11e9,&local_1200);
  local_1201 = 'u';
  QLatin1String::QLatin1String(&local_1218,"uint");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fc0,&local_1201,&local_1218);
  local_1219 = 'u';
  QLatin1String::QLatin1String(&local_1230,"ulong");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fa8,&local_1219,&local_1230);
  local_1231 = 'u';
  QLatin1String::QLatin1String(&local_1248,"ushort");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f90,&local_1231,&local_1248);
  local_1249 = 'v';
  QLatin1String::QLatin1String(&local_1260,"var");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f78,&local_1249,&local_1260);
  local_1261 = 'v';
  QLatin1String::QLatin1String(&local_1278,"void");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f60,&local_1261,&local_1278);
  local_f48 = &local_10e0;
  local_f40 = 0x11;
  list_01._M_len = 0x11;
  list_01._M_array = local_f48;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_f38,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&csharp_types,&local_f38);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_f38);
  local_12e1 = 'f';
  QLatin1String::QLatin1String(&local_12f8,"false");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_12e0,&local_12e1,&local_12f8);
  local_12f9 = 't';
  QLatin1String::QLatin1String(&local_1310,"true");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_12c8,&local_12f9,&local_1310);
  local_1311 = 'n';
  QLatin1String::QLatin1String(&local_1328,"null");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_12b0,&local_1311,&local_1328);
  local_1298 = &local_12e0;
  local_1290 = 3;
  list_00._M_len = 3;
  list_00._M_array = local_1298;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_1288,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&csharp_literals,&local_1288);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1288);
  memset(&local_1338,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_1338);
  QMultiHash<char,_QLatin1String>::operator=(&csharp_builtin,&local_1338);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1338);
  local_1479 = 'd';
  QLatin1String::QLatin1String(&local_1490,"define");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_1478,&local_1479,&local_1490);
  local_1491 = 'e';
  QLatin1String::QLatin1String(&local_14a8,"elif");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1460,&local_1491,&local_14a8);
  local_14a9 = 'e';
  QLatin1String::QLatin1String(&local_14c0,"else");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1448,&local_14a9,&local_14c0);
  local_14c1 = 'e';
  QLatin1String::QLatin1String(&local_14d8,"endif");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1430,&local_14c1,&local_14d8);
  local_14d9 = 'e';
  QLatin1String::QLatin1String(&local_14f0,"endregion");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1418,&local_14d9,&local_14f0);
  local_14f1 = 'e';
  QLatin1String::QLatin1String(&local_1508,"error");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1400,&local_14f1,&local_1508);
  local_1509 = 'i';
  QLatin1String::QLatin1String(&local_1520,"if");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13e8,&local_1509,&local_1520);
  local_1521 = 'l';
  QLatin1String::QLatin1String(&local_1538,"line");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13d0,&local_1521,&local_1538);
  local_1539 = 'p';
  QLatin1String::QLatin1String(&local_1550,"pragma");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13b8,&local_1539,&local_1550);
  local_1551 = 'r';
  QLatin1String::QLatin1String(&local_1568,"region");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13a0,&local_1551,&local_1568);
  local_1569 = 'u';
  QLatin1String::QLatin1String(&local_1580,"undef");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1388,&local_1569,&local_1580);
  local_1581 = 'w';
  QLatin1String::QLatin1String(&local_1598,"warning");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1370,&local_1581,&local_1598);
  local_1358 = &local_1478;
  local_1350 = 0xc;
  list._M_len = 0xc;
  list._M_array = local_1358;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_1348,list);
  QMultiHash<char,_QLatin1String>::operator=(&csharp_other,&local_1348);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_1348);
  return;
}

Assistant:

void initCSharpData() {
    csharp_keywords = {{('a'), QLatin1String("abstract")},
                       {('a'), QLatin1String("add")},
                       {('a'), QLatin1String("alias")},
                       {('a'), QLatin1String("as")},
                       {('a'), QLatin1String("ascending")},
                       {('a'), QLatin1String("async")},
                       {('a'), QLatin1String("await")},
                       {('b'), QLatin1String("base")},
                       {('b'), QLatin1String("break")},
                       {('c'), QLatin1String("case")},
                       {('c'), QLatin1String("catch")},
                       {('c'), QLatin1String("checked")},
                       {('c'), QLatin1String("const")},
                       {('c'), QLatin1String("continue")},
                       {('d'), QLatin1String("decimal")},
                       {('d'), QLatin1String("default")},
                       {('d'), QLatin1String("delegate")},
                       {('d'), QLatin1String("descending")},
                       {('d'), QLatin1String("do")},
                       {('d'), QLatin1String("dynamic")},
                       {('e'), QLatin1String("else")},
                       {('e'), QLatin1String("event")},
                       {('e'), QLatin1String("explicit")},
                       {('e'), QLatin1String("extern")},
                       {('f'), QLatin1String("finally")},
                       {('f'), QLatin1String("fixed")},
                       {('f'), QLatin1String("for")},
                       {('f'), QLatin1String("foreach")},
                       {('f'), QLatin1String("from")},
                       {('g'), QLatin1String("get")},
                       {('g'), QLatin1String("global")},
                       {('g'), QLatin1String("goto")},
                       {('g'), QLatin1String("group")},
                       {('i'), QLatin1String("if")},
                       {('i'), QLatin1String("implicit")},
                       {('i'), QLatin1String("in")},
                       {('i'), QLatin1String("interface")},
                       {('i'), QLatin1String("internal")},
                       {('i'), QLatin1String("into")},
                       {('i'), QLatin1String("is")},
                       {('j'), QLatin1String("join")},
                       {('l'), QLatin1String("let")},
                       {('l'), QLatin1String("lock")},
                       {('l'), QLatin1String("long")},
                       {('n'), QLatin1String("namespace")},
                       {('n'), QLatin1String("new")},
                       {('o'), QLatin1String("object")},
                       {('o'), QLatin1String("operator")},
                       {('o'), QLatin1String("orderby")},
                       {('o'), QLatin1String("out")},
                       {('o'), QLatin1String("override")},
                       {('p'), QLatin1String("params")},
                       {('p'), QLatin1String("partial")},
                       {('p'), QLatin1String("private")},
                       {('p'), QLatin1String("protected")},
                       {('p'), QLatin1String("public")},
                       {('r'), QLatin1String("readonly")},
                       {('r'), QLatin1String("ref")},
                       {('r'), QLatin1String("remove")},
                       {('r'), QLatin1String("return")},
                       {('s'), QLatin1String("sealed")},
                       {('s'), QLatin1String("select")},
                       {('s'), QLatin1String("set")},
                       {('s'), QLatin1String("sizeof")},
                       {('s'), QLatin1String("stackalloc")},
                       {('s'), QLatin1String("static")},
                       {('s'), QLatin1String("switch")},
                       {('t'), QLatin1String("this")},
                       {('t'), QLatin1String("throw")},
                       {('t'), QLatin1String("try")},
                       {('t'), QLatin1String("typeof")},
                       {('u'), QLatin1String("unchecked")},
                       {('u'), QLatin1String("unsafe")},
                       {('u'), QLatin1String("using")},
                       {('v'), QLatin1String("value")},
                       {('v'), QLatin1String("virtual")},
                       {('v'), QLatin1String("volatile")},
                       {('w'), QLatin1String("where")},
                       {('w'), QLatin1String("while")},
                       {('y'), QLatin1String("yield")}};

    csharp_types = {
        {('b'), QLatin1String("bool")},   {('b'), QLatin1String("byte")},
        {('c'), QLatin1String("char")},   {('c'), QLatin1String("class")},
        {('d'), QLatin1String("double")}, {('e'), QLatin1String("enum")},
        {('f'), QLatin1String("float")},  {('i'), QLatin1String("int")},
        {('s'), QLatin1String("sbyte")},  {('s'), QLatin1String("short")},
        {('s'), QLatin1String("string")}, {('s'), QLatin1String("struct")},
        {('u'), QLatin1String("uint")},   {('u'), QLatin1String("ulong")},
        {('u'), QLatin1String("ushort")}, {('v'), QLatin1String("var")},
        {('v'), QLatin1String("void")},
    };

    csharp_literals = {{('f'), QLatin1String("false")},
                       {('t'), QLatin1String("true")},
                       {('n'), QLatin1String("null")}};

    csharp_builtin = {

    };

    csharp_other = {
        {('d'), QLatin1String("define")},    {('e'), QLatin1String("elif")},
        {('e'), QLatin1String("else")},      {('e'), QLatin1String("endif")},
        {('e'), QLatin1String("endregion")}, {('e'), QLatin1String("error")},
        {('i'), QLatin1String("if")},        {('l'), QLatin1String("line")},
        {('p'), QLatin1String("pragma")},    {('r'), QLatin1String("region")},
        {('u'), QLatin1String("undef")},     {('w'), QLatin1String("warning")}};
}